

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

ConstraintBlockSymbol *
slang::ast::ConstraintBlockSymbol::fromSyntax(Scope *scope,ConstraintPrototypeSyntax *syntax)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  short sVar2;
  SyntaxNode *this;
  Compilation *args;
  size_type sVar3;
  pointer pTVar4;
  Type *type;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  ConstraintBlockSymbol *this_00;
  long lVar5;
  ClassType *classType;
  SourceRange sourceRange;
  Token nameToken;
  SourceLocation local_50;
  Token local_48;
  string_view local_38;
  
  this = (SyntaxNode *)(syntax->name).ptr;
  if (this == (SyntaxNode *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::NameSyntax *>::get() const [T = slang::syntax::NameSyntax *]"
              );
  }
  args = scope->compilation;
  local_48 = slang::syntax::SyntaxNode::getLastToken(this);
  local_38 = parsing::Token::valueText(&local_48);
  local_50 = parsing::Token::location(&local_48);
  this_00 = BumpAllocator::
            emplace<slang::ast::ConstraintBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                      (&args->super_BumpAllocator,args,&local_38,&local_50);
  (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  psVar1 = &(syntax->super_MemberSyntax).attributes.
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
  syntax_00.data_ = psVar1->data_;
  syntax_00.size_ = psVar1->size_;
  if ((syntax->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ == 0 ||
      psVar1->data_ != (pointer)0x0) {
    Symbol::setAttributes(&this_00->super_Symbol,scope,syntax_00);
    this_00->isExtern = true;
    sVar3 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>.size_;
    if (sVar3 != 0) {
      pTVar4 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>.data_;
      lVar5 = 0;
      do {
        sVar2 = *(short *)((long)&pTVar4->kind + lVar5);
        if (sVar2 == 0xa8) {
          this_00->isExplicitExtern = true;
        }
        else if (sVar2 == 0xf9) {
          this_00->isPure = true;
        }
        else if (sVar2 == 0x11d) {
          this_00->isStatic = true;
        }
        lVar5 = lVar5 + 0x10;
      } while (sVar3 << 4 != lVar5);
    }
    type = (Type *)scope->thisSym;
    if ((type->super_Symbol).kind == ClassType) {
      if ((this_00->isPure == true) && (*(char *)&type[1].super_Symbol.originatingSyntax == '\0')) {
        sourceRange = parsing::Token::range(&local_48);
        Scope::addDiag(scope,(DiagCode)0x870006,sourceRange);
      }
      if (this_00->isStatic == false) {
        addThisVar(this_00,type);
      }
    }
    return this_00;
  }
  std::terminate();
}

Assistant:

ConstraintBlockSymbol& ConstraintBlockSymbol::fromSyntax(const Scope& scope,
                                                         const ConstraintPrototypeSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto nameToken = syntax.name->getLastToken();
    auto result = comp.emplace<ConstraintBlockSymbol>(comp, nameToken.valueText(),
                                                      nameToken.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->isExtern = true;

    for (auto qual : syntax.qualifiers) {
        switch (qual.kind) {
            case TokenKind::StaticKeyword:
                result->isStatic = true;
                break;
            case TokenKind::ExternKeyword:
                result->isExplicitExtern = true;
                break;
            case TokenKind::PureKeyword:
                result->isPure = true;
                break;
            default:
                break;
        }
    }

    if (scope.asSymbol().kind == SymbolKind::ClassType) {
        auto& classType = scope.asSymbol().as<ClassType>();
        if (result->isPure && !classType.isAbstract)
            scope.addDiag(diag::PureConstraintInAbstract, nameToken.range());

        if (!result->isStatic)
            result->addThisVar(classType);
    }

    return *result;
}